

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int sexp_is_a_socket_p(int fd)

{
  int in_EDI;
  stat statbuf;
  stat sStack_98;
  
  fstat(in_EDI,&sStack_98);
  return (int)((sStack_98.st_mode & 0xf000) == 0xc000);
}

Assistant:

int sexp_is_a_socket_p (int fd) {
#if defined(PLAN9) || defined(_WIN32)
  return 0;
#else
  struct stat statbuf;
  fstat(fd, &statbuf);
  return S_ISSOCK(statbuf.st_mode);
#endif
}